

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::givePowerUp(Player *this,int type)

{
  if (type == 1) {
    this->weapon = 1;
  }
  else if (type == 0) {
    this->lives = this->lives + 1;
    return;
  }
  return;
}

Assistant:

void Player::givePowerUp(int type)
{
   switch (type) {
      case POWERUP_LIFE:
         lives++;
         break;
      case POWERUP_WEAPON:
         weapon = WEAPON_LARGE;
         break;
   }
}